

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O1

void ShowDoubleArray(double *inDoubleArray,int inSize)

{
  ostream *poVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
  if (0 < inSize) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(inDoubleArray[uVar2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      uVar2 = uVar2 + 1;
    } while ((uint)inSize != uVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]",1);
  return;
}

Assistant:

static void ShowDoubleArray(const double inDoubleArray[],int inSize)
{
	cout<<"[ ";
	for(int i=0;i<inSize;++i)
		cout<<Double(inDoubleArray[i])<<" ";
	cout<<"]";
}